

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O1

int ebur128_set_max_history(ebur128_state *st,unsigned_long history)

{
  ebur128_dq_entry *peVar1;
  ebur128_dq_entry *peVar2;
  ebur128_state_internal *peVar3;
  ulong uVar4;
  int iVar5;
  
  uVar4 = 3000;
  if (2999 < history || (~st->mode & 0xbU) != 0) {
    uVar4 = 400;
    if (400 < history) {
      uVar4 = history;
    }
    if ((st->mode & 1U) == 0) {
      uVar4 = history;
    }
  }
  peVar3 = st->d;
  iVar5 = 4;
  if (uVar4 != peVar3->history) {
    peVar3->history = uVar4;
    peVar3->block_list_max = uVar4 / 100;
    peVar3->st_block_list_max = uVar4 / 3000;
    peVar3 = st->d;
    uVar4 = peVar3->block_list_size;
    while (peVar3->block_list_max < uVar4) {
      peVar1 = (peVar3->block_list).stqh_first;
      peVar2 = (peVar1->entries).stqe_next;
      (peVar3->block_list).stqh_first = peVar2;
      if (peVar2 == (ebur128_dq_entry *)0x0) {
        (peVar3->block_list).stqh_last = &(peVar3->block_list).stqh_first;
      }
      free(peVar1);
      peVar3 = st->d;
      uVar4 = peVar3->block_list_size - 1;
      peVar3->block_list_size = uVar4;
    }
    peVar3 = st->d;
    uVar4 = peVar3->st_block_list_size;
    iVar5 = 0;
    while (peVar3->st_block_list_max < uVar4) {
      peVar1 = (peVar3->short_term_block_list).stqh_first;
      peVar2 = (peVar1->entries).stqe_next;
      (peVar3->short_term_block_list).stqh_first = peVar2;
      if (peVar2 == (ebur128_dq_entry *)0x0) {
        (peVar3->short_term_block_list).stqh_last = &(peVar3->short_term_block_list).stqh_first;
      }
      free(peVar1);
      peVar3 = st->d;
      uVar4 = peVar3->st_block_list_size - 1;
      peVar3->st_block_list_size = uVar4;
    }
  }
  return iVar5;
}

Assistant:

int ebur128_set_max_history(ebur128_state* st, unsigned long history) {
  if ((st->mode & EBUR128_MODE_LRA) == EBUR128_MODE_LRA && history < 3000) {
    history = 3000;
  } else if ((st->mode & EBUR128_MODE_M) == EBUR128_MODE_M && history < 400) {
    history = 400;
  }
  if (history == st->d->history) {
    return EBUR128_ERROR_NO_CHANGE;
  }
  st->d->history = history;
  st->d->block_list_max = st->d->history / 100;
  st->d->st_block_list_max = st->d->history / 3000;
  while (st->d->block_list_size > st->d->block_list_max) {
    struct ebur128_dq_entry* block = STAILQ_FIRST(&st->d->block_list);
    STAILQ_REMOVE_HEAD(&st->d->block_list, entries);
    free(block);
    st->d->block_list_size--;
  }
  while (st->d->st_block_list_size > st->d->st_block_list_max) {
    struct ebur128_dq_entry* block =
        STAILQ_FIRST(&st->d->short_term_block_list);
    STAILQ_REMOVE_HEAD(&st->d->short_term_block_list, entries);
    free(block);
    st->d->st_block_list_size--;
  }
  return EBUR128_SUCCESS;
}